

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_writer_utils.c
# Opt level: O3

uint8_t * VP8LBitWriterFinish(VP8LBitWriter *bw)

{
  uint8_t *puVar1;
  int iVar2;
  ulong uVar3;
  
  iVar2 = VP8LBitWriterResize(bw,(long)(bw->used + 7 >> 3));
  if (iVar2 != 0) {
    if (0 < bw->used) {
      uVar3 = bw->bits;
      do {
        puVar1 = bw->cur;
        bw->cur = puVar1 + 1;
        *puVar1 = (uint8_t)uVar3;
        uVar3 = bw->bits >> 8;
        bw->bits = uVar3;
        iVar2 = bw->used;
        bw->used = iVar2 + -8;
      } while (8 < iVar2);
    }
    bw->used = 0;
  }
  return bw->buf;
}

Assistant:

uint8_t* VP8LBitWriterFinish(VP8LBitWriter* const bw) {
  // flush leftover bits
  if (VP8LBitWriterResize(bw, (bw->used + 7) >> 3)) {
    while (bw->used > 0) {
      *bw->cur++ = (uint8_t)bw->bits;
      bw->bits >>= 8;
      bw->used -= 8;
    }
    bw->used = 0;
  }
  return bw->buf;
}